

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall ON_Viewport::CopyFrom(ON_Viewport *this,ON_Object *src)

{
  ON_Viewport *pOVar1;
  
  pOVar1 = Cast(src);
  if (pOVar1 != (ON_Viewport *)0x0) {
    operator=(this,pOVar1);
  }
  return pOVar1 != (ON_Viewport *)0x0;
}

Assistant:

static double len2d( double x, double y )
{
  double d= 0.0;
  double fx = fabs(x);
  double fy = fabs(y);
  if ( fx > fy ) {
    d = fy/fx;
    d = fx*sqrt(1.0+d*d);
  }
  else if ( fy > fx ){
    d = fx/fy;
    d = fy*sqrt(1.0+d*d);
  }
  return d;
}